

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall
fmt::v5::format_system_error(v5 *this,buffer *out,int error_code,string_view message)

{
  ulong uVar1;
  long lVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  undefined4 in_register_00000014;
  basic_buffer<char> *c;
  char *pcVar5;
  undefined **local_248;
  char *local_240;
  ulong local_238;
  ulong local_230;
  char local_228 [504];
  
  pcVar4 = message.data_;
  local_248 = &PTR_grow_00124ff0;
  local_230 = 500;
  local_238 = 500;
  local_240 = local_228;
  __s = strerror_r((int)out,local_228,500);
  if (local_228 == __s) {
    sVar3 = strlen(local_228);
    if (sVar3 == 499) {
      do {
        uVar1 = local_238 * 2;
        if (local_230 < uVar1) {
          (*(code *)*local_248)(&local_248,uVar1);
        }
        pcVar5 = local_240;
        local_238 = uVar1;
        __s = strerror_r((int)out,local_240,uVar1);
        if (pcVar5 != __s) break;
        sVar3 = strlen(pcVar5);
      } while (sVar3 == uVar1 - 1);
    }
  }
  lVar2 = *(long *)(this + 0x10);
  pcVar5 = pcVar4 + lVar2;
  if (*(char **)(this + 0x18) < pcVar5) {
    (*(code *)**(undefined8 **)this)(this,pcVar5);
  }
  *(char **)(this + 0x10) = pcVar5;
  if (pcVar4 != (char *)0x0) {
    memmove((void *)(lVar2 + *(long *)(this + 8)),(void *)CONCAT44(in_register_00000014,error_code),
            (size_t)pcVar4);
    pcVar5 = *(char **)(this + 0x10);
  }
  pcVar4 = pcVar5 + 2;
  if (*(char **)(this + 0x18) < pcVar4) {
    (*(code *)**(undefined8 **)this)(this,pcVar4);
  }
  *(char **)(this + 0x10) = pcVar4;
  lVar2 = *(long *)(this + 8);
  (pcVar5 + lVar2)[0] = ':';
  (pcVar5 + lVar2)[1] = ' ';
  sVar3 = strlen(__s);
  lVar2 = *(long *)(this + 0x10);
  uVar1 = lVar2 + sVar3;
  if (*(ulong *)(this + 0x18) < uVar1) {
    (*(code *)**(undefined8 **)this)(this,uVar1);
  }
  *(ulong *)(this + 0x10) = uVar1;
  if (sVar3 != 0) {
    memmove((void *)(lVar2 + *(long *)(this + 8)),__s,sVar3);
  }
  local_248 = &PTR_grow_00124ff0;
  if (local_240 != local_228) {
    operator_delete(local_240,local_230);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(
    internal::buffer &out, int error_code, string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char *system_message = &buf[0];
      int result = safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        writer w(out);
        w.write(message);
        w.write(": ");
        w.write(system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }